

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

bool opts::Options::dashed_non_option(char *arg,IsShort *is_short)

{
  char __args;
  bool bVar1;
  
  if (*arg == '-') {
    __args = arg[1];
    if (__args == 0x2e || (int)__args - 0x30U < 10) {
      bVar1 = std::function<bool_(char)>::operator()(is_short,__args);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

static bool     dashed_non_option(char* arg, BasicOption::IsShort is_short)
    {
        return arg[ 0 ] == '-'
                && (std::isdigit(arg[ 1 ]) || arg[ 1 ] == '.')
                && !is_short(arg[ 1 ]);
    }